

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_global_motion_estimation_mt(AV1_COMP *cpi)

{
  EncWorkerData *pEVar1;
  ThreadData *pTVar2;
  AVxWorker *pAVar3;
  undefined1 *puVar4;
  MultiThreadInfo *pMVar5;
  AV1GlobalMotionSync *pAVar6;
  uint uVar7;
  int iVar8;
  uint8_t *puVar9;
  int *piVar10;
  AVxWorkerInterface *pAVar11;
  AVxWorker *pAVar12;
  ulong uVar13;
  EncWorkerData *pEVar14;
  char cVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  pAVar6 = &(cpi->mt_info).gm_sync;
  (pAVar6->job_info).thread_id_to_dir[0x30] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x31] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x32] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x33] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x34] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x35] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x36] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x37] = '\0';
  pAVar6 = &(cpi->mt_info).gm_sync;
  (pAVar6->job_info).thread_id_to_dir[0x38] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x39] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x3a] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x3b] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x3c] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x3d] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x3e] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x3f] = '\0';
  pAVar6 = &(cpi->mt_info).gm_sync;
  (pAVar6->job_info).thread_id_to_dir[0x20] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x21] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x22] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x23] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x24] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x25] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x26] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x27] = '\0';
  pAVar6 = &(cpi->mt_info).gm_sync;
  (pAVar6->job_info).thread_id_to_dir[0x28] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x29] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x2a] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x2b] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x2c] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x2d] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x2e] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x2f] = '\0';
  pAVar6 = &(cpi->mt_info).gm_sync;
  (pAVar6->job_info).thread_id_to_dir[0x10] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x11] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x12] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x13] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x14] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x15] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x16] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x17] = '\0';
  pAVar6 = &(cpi->mt_info).gm_sync;
  (pAVar6->job_info).thread_id_to_dir[0x18] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x19] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x1a] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x1b] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x1c] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x1d] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x1e] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0x1f] = '\0';
  pMVar5 = &cpi->mt_info;
  (pMVar5->gm_sync).job_info.thread_id_to_dir[0] = '\0';
  (pMVar5->gm_sync).job_info.thread_id_to_dir[1] = '\0';
  (pMVar5->gm_sync).job_info.thread_id_to_dir[2] = '\0';
  (pMVar5->gm_sync).job_info.thread_id_to_dir[3] = '\0';
  (pMVar5->gm_sync).job_info.thread_id_to_dir[4] = '\0';
  (pMVar5->gm_sync).job_info.thread_id_to_dir[5] = '\0';
  (pMVar5->gm_sync).job_info.thread_id_to_dir[6] = '\0';
  (pMVar5->gm_sync).job_info.thread_id_to_dir[7] = '\0';
  pAVar6 = &(cpi->mt_info).gm_sync;
  (pAVar6->job_info).thread_id_to_dir[8] = '\0';
  (pAVar6->job_info).thread_id_to_dir[9] = '\0';
  (pAVar6->job_info).thread_id_to_dir[10] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0xb] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0xc] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0xd] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0xe] = '\0';
  (pAVar6->job_info).thread_id_to_dir[0xf] = '\0';
  (cpi->mt_info).gm_sync.job_info.early_exit[0] = '\0';
  (cpi->mt_info).gm_sync.job_info.early_exit[1] = '\0';
  (cpi->mt_info).gm_sync.job_info.next_frame_to_process[0] = '\0';
  (cpi->mt_info).gm_sync.job_info.next_frame_to_process[1] = '\0';
  uVar7 = (cpi->gm_info).num_ref_frames[1] + (cpi->gm_info).num_ref_frames[0];
  uVar21 = 2;
  if ((int)uVar7 < 2) {
    uVar21 = uVar7;
  }
  if ((cpi->sf).gm_sf.prune_ref_frame_for_gm_search == 0) {
    uVar21 = uVar7;
  }
  uVar7 = (cpi->mt_info).num_workers;
  if ((int)uVar7 <= (int)uVar21) {
    uVar21 = uVar7;
  }
  uVar23 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    (cpi->mt_info).gm_sync.gm_mt_exit = false;
    aom_get_worker_interface();
  }
  else {
    uVar13 = 0;
    cVar15 = '\0';
    do {
      (cpi->mt_info).gm_sync.job_info.thread_id_to_dir[uVar13] = cVar15;
      cVar15 = cVar15 + '\x01';
      if (cVar15 == '\x02') {
        cVar15 = '\0';
      }
      uVar13 = uVar13 + 1;
    } while (uVar23 != uVar13);
    (cpi->mt_info).gm_sync.gm_mt_exit = false;
    lVar16 = uVar23 - 1;
    pAVar12 = (cpi->mt_info).workers;
    pEVar1 = (cpi->mt_info).tile_thr_data;
    pEVar14 = pEVar1 + lVar16;
    pAVar12[lVar16].hook = gm_mt_worker_hook;
    pAVar12[lVar16].data1 = pEVar14;
    pAVar12[lVar16].data2 = (void *)0x0;
    pEVar1[lVar16].thread_id = (int)lVar16;
    pEVar1[lVar16].start = (int)lVar16;
    pEVar1[lVar16].cpi = cpi;
    if (lVar16 != 0) {
      iVar22 = uVar21 - 2;
      lVar18 = uVar23 * -0x1d0 + 0x1d0;
      lVar19 = uVar23 * 0x1d0 + -0x3a0;
      lVar20 = uVar23 * 0x38 + -0x48;
      lVar17 = lVar16;
      do {
        pTVar2 = pEVar14->original_td;
        pEVar14->td = pTVar2;
        if (pTVar2 != &cpi->td) {
          puVar9 = (uint8_t *)
                   aom_malloc((long)(cpi->gm_info).segment_map_h *
                              (long)(cpi->gm_info).segment_map_w);
          (pTVar2->gm_data).segment_map = puVar9;
          if (puVar9 == (uint8_t *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate gm_data->segment_map");
          }
          (pTVar2->gm_data).motion_models[0].inliers = (int *)0x0;
          *(undefined8 *)&(pTVar2->gm_data).motion_models[0].num_inliers = 0;
          (pTVar2->gm_data).motion_models[0].params[4] = 0.0;
          (pTVar2->gm_data).motion_models[0].params[5] = 0.0;
          (pTVar2->gm_data).motion_models[0].params[2] = 0.0;
          (pTVar2->gm_data).motion_models[0].params[3] = 0.0;
          (pTVar2->gm_data).motion_models[0].params[0] = 0.0;
          (pTVar2->gm_data).motion_models[0].params[1] = 0.0;
          piVar10 = (int *)aom_malloc(0x8000);
          (pTVar2->gm_data).motion_models[0].inliers = piVar10;
          if (piVar10 == (int *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate gm_data->motion_models[m].inliers");
          }
        }
        lVar17 = lVar17 + -1;
        pAVar12 = (cpi->mt_info).workers;
        pEVar1 = (cpi->mt_info).tile_thr_data;
        pEVar14 = pEVar1 + lVar17;
        *(code **)((long)pAVar12 + lVar20 + -0x10) = gm_mt_worker_hook;
        *(char **)((long)pAVar12 + lVar20 + -8) = (pEVar1->error_info).detail + lVar19 + -0x20;
        *(undefined8 *)((long)&pAVar12->impl_ + lVar20) = 0;
        *(int *)((long)&pEVar1->thread_id + lVar19) = iVar22;
        *(int *)((long)&pEVar1->start + lVar19) = iVar22;
        *(AV1_COMP **)((pEVar1->error_info).detail + lVar19 + -0x20) = cpi;
        iVar22 = iVar22 + -1;
        lVar18 = lVar18 + 0x1d0;
        lVar19 = lVar19 + -0x1d0;
        lVar20 = lVar20 + -0x38;
      } while (lVar17 != 0);
      pEVar14 = (EncWorkerData *)((long)pEVar1 - lVar18);
    }
    pEVar14->td = &cpi->td;
    pAVar11 = aom_get_worker_interface();
    pAVar3 = (cpi->mt_info).workers;
    pAVar12 = pAVar3 + lVar16;
    pAVar3[lVar16].had_error = 0;
    if (lVar16 != 0) {
      lVar17 = uVar23 * -0x38 + 0x38;
      lVar18 = uVar23 * 0x38 + -0x40;
      do {
        (*pAVar11->launch)(pAVar12);
        lVar16 = lVar16 + -1;
        pAVar3 = (cpi->mt_info).workers;
        pAVar12 = pAVar3 + lVar16;
        *(undefined4 *)((long)&pAVar3->impl_ + lVar18) = 0;
        lVar17 = lVar17 + 0x38;
        lVar18 = lVar18 + -0x38;
      } while (lVar16 != 0);
      pAVar12 = (AVxWorker *)((long)pAVar3 - lVar17);
    }
    (*pAVar11->execute)(pAVar12);
  }
  pAVar11 = aom_get_worker_interface();
  pAVar12 = (cpi->mt_info).workers;
  iVar22 = pAVar12->had_error;
  if (iVar22 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar12->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar21) {
    uVar13 = uVar23 + 1;
    lVar16 = uVar23 * 0x38;
    do {
      pAVar3 = (cpi->mt_info).workers;
      iVar8 = (*pAVar11->sync)((AVxWorker *)((long)&pAVar3[-1].impl_ + lVar16));
      if (iVar8 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar3[-1].data1 + lVar16) + 0x18),0x1a0);
        iVar22 = 1;
      }
      uVar13 = uVar13 - 1;
      lVar16 = lVar16 + -0x38;
    } while (2 < uVar13);
  }
  if (iVar22 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar12->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar21) {
    lVar16 = 0;
    do {
      puVar4 = *(undefined1 **)
                ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar16 + -0x18);
      if ((ThreadData *)puVar4 != &cpi->td) {
        aom_free(*(void **)(puVar4 + 0x26e38));
        *(undefined8 *)(puVar4 + 0x26e38) = 0;
        aom_free(*(void **)(puVar4 + 0x26e28));
        *(undefined8 *)(puVar4 + 0x26e28) = 0;
      }
      lVar16 = lVar16 + 0x1d0;
    } while (uVar23 * 0x1d0 - lVar16 != 0);
  }
  return;
}

Assistant:

void av1_global_motion_estimation_mt(AV1_COMP *cpi) {
  GlobalMotionJobInfo *job_info = &cpi->mt_info.gm_sync.job_info;

  av1_zero(*job_info);

  int num_workers = compute_gm_workers(cpi);

  assign_thread_to_dir(job_info->thread_id_to_dir, num_workers);
  prepare_gm_workers(cpi, gm_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, &cpi->common, num_workers);
  gm_dealloc_thread_data(cpi, num_workers);
}